

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_timer.c
# Opt level: O0

void test_create_timer_eventloop_register_read_fails(void)

{
  cio_error cVar1;
  undefined1 local_48 [4];
  cio_error err;
  cio_timer timer;
  
  timerfd_create_fake.return_val = 5;
  cio_linux_eventloop_register_read_fake.return_val = CIO_INVALID_ARGUMENT;
  cVar1 = cio_timer_init((cio_timer *)local_48,(cio_eventloop *)0x0,(cio_timer_close_hook_t)0x0);
  if (cVar1 != CIO_SUCCESS) {
    UnityAssertEqualNumber
              (1,(ulong)cio_linux_eventloop_add_fake.call_count,(char *)0x0,0xc9,
               UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (1,(ulong)cio_linux_eventloop_register_read_fake.call_count,(char *)0x0,0xca,
               UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber(1,(ulong)close_fake.call_count,(char *)0x0,0xcb,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber(5,(long)close_fake.arg0_val,(char *)0x0,0xcc,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (1,(ulong)cio_linux_eventloop_remove_fake.call_count,(char *)0x0,0xcd,
               UNITY_DISPLAY_STYLE_INT);
    return;
  }
  UnityFail(" Expression Evaluated To FALSE",200);
}

Assistant:

static void test_create_timer_eventloop_register_read_fails(void)
{
	static const int timerfd = 5;
	timerfd_create_fake.return_val = timerfd;
	cio_linux_eventloop_register_read_fake.return_val = CIO_INVALID_ARGUMENT;

	struct cio_timer timer;
	enum cio_error err = cio_timer_init(&timer, NULL, NULL);
	TEST_ASSERT(err != CIO_SUCCESS);
	TEST_ASSERT_EQUAL(1, cio_linux_eventloop_add_fake.call_count);
	TEST_ASSERT_EQUAL(1, cio_linux_eventloop_register_read_fake.call_count);
	TEST_ASSERT_EQUAL(1, close_fake.call_count);
	TEST_ASSERT_EQUAL(timerfd, close_fake.arg0_val);
	TEST_ASSERT_EQUAL(1, cio_linux_eventloop_remove_fake.call_count);
}